

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Color ColorFromHSV(float hue,float saturation,float value)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  uint uVar8;
  float extraout_XMM0_Db;
  int iVar12;
  undefined1 extraout_var [12];
  undefined1 auVar9 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar13 = hue / 60.0;
  fVar5 = fmodf(fVar13 + 5.0,6.0);
  fVar14 = 4.0 - fVar5;
  if (fVar5 <= 4.0 - fVar5) {
    fVar14 = fVar5;
  }
  if (1.0 <= fVar14) {
    fVar14 = 1.0;
  }
  if (fVar14 <= 0.0) {
    fVar14 = 0.0;
  }
  fVar5 = saturation * value;
  fVar6 = fmodf(fVar13 + 3.0,6.0);
  auVar16._0_4_ = fmodf(fVar13 + 1.0,6.0);
  auVar16._4_12_ = extraout_var;
  auVar10._12_4_ = extraout_var._8_4_;
  auVar10._0_8_ = auVar16._0_8_;
  auVar10._8_4_ = extraout_var._0_4_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = fVar6;
  auVar9._0_4_ = auVar16._0_4_;
  auVar11._0_12_ = auVar9._0_12_;
  auVar11._12_4_ = extraout_XMM0_Db;
  auVar15._0_4_ = 4.0 - auVar16._0_4_;
  auVar15._4_4_ = 4.0 - fVar6;
  auVar15._8_4_ = 0.0 - extraout_var._0_4_;
  auVar15._12_4_ = 0.0 - extraout_XMM0_Db;
  auVar16 = minps(auVar15,auVar11);
  auVar16 = minps(auVar16,_DAT_001b5b80);
  auVar16 = maxps(auVar16,ZEXT816(0));
  iVar7 = (int)((value - fVar5 * auVar16._0_4_) * 255.0);
  iVar12 = (int)((value - fVar5 * auVar16._4_4_) * 255.0);
  sVar1 = (short)iVar7;
  sVar2 = (short)((uint)iVar7 >> 0x10);
  sVar3 = (short)iVar12;
  sVar4 = (short)((uint)iVar12 >> 0x10);
  uVar8 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * (char)((uint)iVar12 >> 0x10) - (0xff < sVar4),
                   CONCAT12((0 < sVar3) * (sVar3 < 0x100) * (char)iVar12 - (0xff < sVar3),
                            CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)((uint)iVar7 >> 0x10) -
                                     (0xff < sVar2),
                                     (0 < sVar1) * (sVar1 < 0x100) * (char)iVar7 - (0xff < sVar1))))
  ;
  return (Color)((int)((value - fVar14 * fVar5) * 255.0) & 0xffU |
                 (uVar8 >> 0x10) << 8 | uVar8 << 0x10 | 0xff000000);
}

Assistant:

Color ColorFromHSV(float hue, float saturation, float value)
{
    Color color = { 0, 0, 0, 255 };

    // Red channel
    float k = fmodf((5.0f + hue/60.0f), 6);
    float t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.r = (unsigned char)((value - value*saturation*k)*255.0f);

    // Green channel
    k = fmodf((3.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.g = (unsigned char)((value - value*saturation*k)*255.0f);

    // Blue channel
    k = fmodf((1.0f + hue/60.0f), 6);
    t = 4.0f - k;
    k = (t < k)? t : k;
    k = (k < 1)? k : 1;
    k = (k > 0)? k : 0;
    color.b = (unsigned char)((value - value*saturation*k)*255.0f);

    return color;
}